

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessmanager.cpp
# Opt level: O2

QNetworkReply * __thiscall
QNetworkAccessManager::createRequest
          (QNetworkAccessManager *this,Operation op,QNetworkRequest *originalReq,
          QIODevice *outgoingData)

{
  QNetworkAccessManagerPrivate *this_00;
  QNetworkReplyImplPrivate *pQVar1;
  QNetworkCookieJar *pQVar2;
  QAnyStringView value;
  QAnyStringView newValue;
  Data *pDVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  qsizetype qVar6;
  char cVar7;
  bool bVar8;
  int iVar9;
  milliseconds mVar10;
  QNetworkReplyFileImpl *this_01;
  QNetworkAccessCacheBackend *this_02;
  char16_t (*pacVar11) [17];
  QObject *pQVar12;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QLatin1String QVar13;
  QUrl stsUrl;
  QHttpHeaders h;
  QNetworkRequest request;
  QArrayDataPointer<char16_t> local_138;
  QNetworkRequest req;
  Operation op_local;
  char16_t httpSchemes [5] [17];
  char16_t local_5e [3];
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QNetworkAccessManagerPrivate **)(this + 8);
  req.d.d.ptr = (QSharedDataPointer<QNetworkRequestPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  op_local = op;
  QNetworkRequest::QNetworkRequest(&req,originalReq);
  if (*(int *)(*(long *)(this + 8) + 0xa4) != 1) {
    local_58.shared = (PrivateShared *)0x0;
    local_58._8_8_ = (void *)0x0;
    local_58._16_8_ = 0;
    local_40 = 2;
    QNetworkRequest::attribute
              ((QVariant *)httpSchemes,&req,RedirectPolicyAttribute,(QVariant *)&local_58);
    cVar7 = QVariant::isNull();
    QVariant::~QVariant((QVariant *)httpSchemes);
    QVariant::~QVariant((QVariant *)&local_58);
    if (cVar7 != '\0') {
      QVariant::QVariant((QVariant *)httpSchemes,*(int *)(*(long *)(this + 8) + 0xa4));
      QNetworkRequest::setAttribute(&req,RedirectPolicyAttribute,(QVariant *)httpSchemes);
      QVariant::~QVariant((QVariant *)httpSchemes);
    }
  }
  mVar10 = QNetworkRequest::transferTimeoutAsDuration(&req);
  if (mVar10.__r == 0) {
    QNetworkRequest::setTransferTimeout(&req,(milliseconds)*(rep *)(*(long *)(this + 8) + 0x100));
  }
  if (*(char *)(*(long *)(this + 8) + 0xf9) == '\x01') {
    local_58.shared = (PrivateShared *)0x0;
    local_58._8_8_ = (void *)0x0;
    local_58._16_8_ = 0;
    local_40 = 2;
    QNetworkRequest::attribute
              ((QVariant *)httpSchemes,&req,AutoDeleteReplyOnFinishAttribute,(QVariant *)&local_58);
    cVar7 = QVariant::isNull();
    QVariant::~QVariant((QVariant *)httpSchemes);
    QVariant::~QVariant((QVariant *)&local_58);
    if (cVar7 != '\0') {
      QVariant::QVariant((QVariant *)httpSchemes,true);
      QNetworkRequest::setAttribute(&req,AutoDeleteReplyOnFinishAttribute,(QVariant *)httpSchemes);
      QVariant::~QVariant((QVariant *)httpSchemes);
    }
  }
  QNetworkRequest::url((QNetworkRequest *)httpSchemes);
  cVar7 = QUrl::isLocalFile();
  QUrl::~QUrl((QUrl *)httpSchemes);
  local_138.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_138.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_138.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QNetworkRequest::url((QNetworkRequest *)httpSchemes);
  QUrl::scheme();
  QUrl::~QUrl((QUrl *)httpSchemes);
  httpSchemes[0][0] = L'\n';
  httpSchemes[0][1] = L'\0';
  httpSchemes[0][2] = L'\0';
  httpSchemes[0][3] = L'\0';
  httpSchemes[0]._8_8_ = anon_var_dwarf_f3ed3;
  bVar8 = ::operator==((QString *)&local_138,(QLatin1StringView *)httpSchemes);
  if (bVar8) {
    Qt::Literals::StringLiterals::operator____s((QString *)httpSchemes,L"unix+http",9);
    qVar5 = local_138.size;
    pcVar4 = local_138.ptr;
    pDVar3 = local_138.d;
    local_138.d = (Data *)httpSchemes[0]._0_8_;
    local_138.ptr = (char16_t *)httpSchemes[0]._8_8_;
    httpSchemes[0]._0_8_ = pDVar3;
    httpSchemes[0]._8_8_ = pcVar4;
    local_138.size._0_2_ = httpSchemes[0][8];
    local_138.size._2_2_ = httpSchemes[0][9];
    local_138.size._4_2_ = httpSchemes[0][10];
    local_138.size._6_2_ = httpSchemes[0][0xb];
    qVar6 = local_138.size;
    local_138.size._0_2_ = (undefined2)qVar5;
    local_138.size._2_2_ = SUB82(qVar5,2);
    local_138.size._4_2_ = SUB82(qVar5,4);
    local_138.size._6_2_ = SUB82(qVar5,6);
    httpSchemes[0][8] = (undefined2)local_138.size;
    httpSchemes[0][9] = local_138.size._2_2_;
    httpSchemes[0][10] = local_138.size._4_2_;
    httpSchemes[0][0xb] = local_138.size._6_2_;
    local_138.size = qVar6;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)httpSchemes);
    httpSchemes[0]._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QNetworkRequest::url((QNetworkRequest *)httpSchemes);
    QUrl::setScheme((QString *)httpSchemes);
    QNetworkRequest::setUrl(&req,(QUrl *)httpSchemes);
    QUrl::~QUrl((QUrl *)httpSchemes);
  }
  if (op - HeadOperation < 2) {
    if (cVar7 == '\0') {
      httpSchemes[0][0] = L'\x03';
      httpSchemes[0][1] = L'\0';
      httpSchemes[0][2] = L'\0';
      httpSchemes[0][3] = L'\0';
      httpSchemes[0]._8_8_ = anon_var_dwarf_d8ed7;
      bVar8 = ::operator==((QString *)&local_138,(QLatin1StringView *)httpSchemes);
      if (!bVar8) {
        httpSchemes[0][0] = L'\x04';
        httpSchemes[0][1] = L'\0';
        httpSchemes[0][2] = L'\0';
        httpSchemes[0][3] = L'\0';
        httpSchemes[0]._8_8_ =
             (long)"QNativeSocketEngine::initialize unable to inline out-of-band data" + 0x3d;
        bVar8 = ::operator==((QString *)&local_138,(QLatin1StringView *)httpSchemes);
        if (bVar8) {
          this_01 = (QNetworkReplyFileImpl *)operator_new(0x10);
          QNetworkReplyDataImpl::QNetworkReplyDataImpl
                    ((QNetworkReplyDataImpl *)this_01,(QObject *)this,&req,op);
          goto LAB_00178f29;
        }
        QVariant::QVariant((QVariant *)&local_58,1);
        QNetworkRequest::attribute
                  ((QVariant *)httpSchemes,&req,CacheLoadControlAttribute,(QVariant *)&local_58);
        iVar9 = QVariant::toInt((bool *)httpSchemes);
        QVariant::~QVariant((QVariant *)httpSchemes);
        QVariant::~QVariant((QVariant *)&local_58);
        if (iVar9 == 3) {
          this_01 = (QNetworkReplyFileImpl *)operator_new(0x10);
          QNetworkReplyImpl::QNetworkReplyImpl((QNetworkReplyImpl *)this_01,(QObject *)this);
          pQVar1 = *(QNetworkReplyImplPrivate **)((QNetworkReplyImpl *)this_01 + 8);
          QWeakPointer<QObject>::assign<QObject>
                    (&(pQVar1->super_QNetworkReplyPrivate).manager.wp,(QObject *)this);
          this_02 = (QNetworkAccessCacheBackend *)operator_new(0x18);
          QNetworkAccessCacheBackend::QNetworkAccessCacheBackend(this_02);
          pQVar1->backend = (QNetworkAccessBackend *)this_02;
          QNetworkAccessBackend::setManagerPrivate
                    ((QNetworkAccessBackend *)this_02,*(QNetworkAccessManagerPrivate **)(this + 8));
          QObject::setParent(&pQVar1->backend->super_QObject);
          QNetworkAccessBackend::setReplyPrivate((QNetworkAccessBackend *)pQVar1->backend,pQVar1);
          QNetworkReplyImplPrivate::setup(pQVar1,op,&req,outgoingData);
          goto LAB_00178f29;
        }
        goto LAB_00178b88;
      }
    }
    this_01 = (QNetworkReplyFileImpl *)operator_new(0x10);
    QNetworkReplyFileImpl::QNetworkReplyFileImpl(this_01,(QNetworkAccessManager *)this,&req,op);
  }
  else {
LAB_00178b88:
    request.d.d.ptr = (QSharedDataPointer<QNetworkRequestPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QNetworkRequest::QNetworkRequest(&request,&req);
    h.d.d.ptr = (QExplicitlySharedDataPointer<QHttpHeadersPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QNetworkRequest::headers((QNetworkRequest *)&h);
    bVar8 = QHttpHeaders::contains(&h,ContentLength);
    if ((outgoingData != (QIODevice *)0x0) && (!bVar8)) {
      cVar7 = (**(code **)(*(long *)outgoingData + 0x60))();
      if (cVar7 == '\0') {
        iVar9 = (**(code **)(*(long *)outgoingData + 0x80))();
        QByteArray::number((longlong)httpSchemes,iVar9);
        value.m_size._0_2_ = httpSchemes[0][8];
        value.m_size._2_2_ = httpSchemes[0][9];
        value.m_size._4_2_ = httpSchemes[0][10];
        value.m_size._6_2_ = httpSchemes[0][0xb];
        value.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)httpSchemes[0]._8_8_;
        QHttpHeaders::append(&h,ContentLength,value);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)httpSchemes);
      }
    }
    QVariant::QVariant((QVariant *)&local_58,0);
    QNetworkRequest::attribute
              ((QVariant *)httpSchemes,&request,CookieLoadControlAttribute,(QVariant *)&local_58);
    iVar9 = QVariant::toInt((bool *)httpSchemes);
    QVariant::~QVariant((QVariant *)httpSchemes);
    QVariant::~QVariant((QVariant *)&local_58);
    if ((iVar9 == 0) && (pQVar2 = this_00->cookieJar, pQVar2 != (QNetworkCookieJar *)0x0)) {
      httpSchemes[0]._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      httpSchemes[0]._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      httpSchemes[0]._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QNetworkRequest::url((QNetworkRequest *)&local_58.shared);
      (**(code **)(*(long *)pQVar2 + 0x60))(httpSchemes,pQVar2,&local_58);
      QUrl::~QUrl((QUrl *)&local_58.shared);
      if (httpSchemes[0]._16_8_ != 0) {
        QNetworkHeadersPrivate::fromCookieList
                  ((QByteArray *)&local_58,(QList<QNetworkCookie> *)httpSchemes);
        newValue.m_size = local_58._16_8_;
        newValue.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)local_58._8_8_;
        QHttpHeaders::replaceOrAppend(&h,Cookie,newValue);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
      }
      QArrayDataPointer<QNetworkCookie>::~QArrayDataPointer
                ((QArrayDataPointer<QNetworkCookie> *)httpSchemes);
    }
    QNetworkRequest::setHeaders(&request,&h);
    memcpy(httpSchemes,L"http",0xaa);
    pacVar11 = const(httpSchemes,(char16_t (*) [17])local_5e,&local_138);
    if (pacVar11 == (char16_t (*) [17])local_5e) {
      this_01 = (QNetworkReplyFileImpl *)operator_new(0x10);
      QNetworkReplyImpl::QNetworkReplyImpl((QNetworkReplyImpl *)this_01,(QObject *)this);
      pQVar1 = *(QNetworkReplyImplPrivate **)((QNetworkReplyImpl *)this_01 + 8);
      QWeakPointer<QObject>::assign<QObject>
                (&(pQVar1->super_QNetworkReplyPrivate).manager.wp,(QObject *)this);
      pQVar12 = &QNetworkAccessManagerPrivate::findBackend(this_00,op,&request)->super_QObject;
      pQVar1->backend = (QNetworkAccessBackend *)pQVar12;
      if (pQVar12 != (QObject *)0x0) {
        QObject::setParent(pQVar12);
        QNetworkAccessBackend::setReplyPrivate((QNetworkAccessBackend *)pQVar1->backend,pQVar1);
      }
      QNetworkRequest::sslConfiguration((QNetworkRequest *)&local_58.shared);
      QNetworkReply::setSslConfiguration
                ((QNetworkReply *)this_01,(QSslConfiguration *)&local_58.shared);
      QSslConfiguration::~QSslConfiguration((QSslConfiguration *)&local_58.shared);
      QNetworkReplyImplPrivate::setup(pQVar1,op,&request,outgoingData);
    }
    else {
      QVar13.m_data = (char *)0x4;
      QVar13.m_size = (qsizetype)&local_138;
      cVar7 = QString::startsWith(QVar13,0x23dd48);
      if ((cVar7 == '\0') && (*(char *)(*(long *)(this + 8) + 0xf8) == '\x01')) {
        QNetworkRequest::url((QNetworkRequest *)&local_58.shared);
        bVar8 = QHstsCache::isKnownHost(&this_00->stsCache,(QUrl *)&local_58.shared);
        QUrl::~QUrl((QUrl *)&local_58.shared);
        if (bVar8) {
          stsUrl.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
          QNetworkRequest::url((QNetworkRequest *)&stsUrl);
          iVar9 = QUrl::port((int)(QNetworkRequest *)&stsUrl);
          if (iVar9 == 0x50) {
            QUrl::setPort((int)&stsUrl);
          }
          latin1.m_data = "https";
          latin1.m_size = 5;
          QString::QString((QString *)&local_58,latin1);
          QUrl::setScheme((QString *)&stsUrl);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
          QNetworkRequest::setUrl(&request,&stsUrl);
          QUrl::~QUrl(&stsUrl);
        }
      }
      this_01 = (QNetworkReplyFileImpl *)operator_new(0x10);
      QNetworkReplyHttpImpl::QNetworkReplyHttpImpl
                ((QNetworkReplyHttpImpl *)this_01,(QNetworkAccessManager *)this,&request,&op_local,
                 outgoingData);
    }
    QHttpHeaders::~QHttpHeaders(&h);
    QNetworkRequest::~QNetworkRequest(&request);
  }
LAB_00178f29:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
  QNetworkRequest::~QNetworkRequest(&req);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QNetworkReply *)this_01;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkReply *QNetworkAccessManager::createRequest(QNetworkAccessManager::Operation op,
                                                    const QNetworkRequest &originalReq,
                                                    QIODevice *outgoingData)
{
    Q_D(QNetworkAccessManager);

    QNetworkRequest req(originalReq);
    if (redirectPolicy() != QNetworkRequest::NoLessSafeRedirectPolicy
        && req.attribute(QNetworkRequest::RedirectPolicyAttribute).isNull()) {
        req.setAttribute(QNetworkRequest::RedirectPolicyAttribute, redirectPolicy());
    }

#if QT_CONFIG(http) || defined (Q_OS_WASM)
    if (req.transferTimeoutAsDuration() == 0ms)
        req.setTransferTimeout(transferTimeoutAsDuration());
#endif

    if (autoDeleteReplies()
        && req.attribute(QNetworkRequest::AutoDeleteReplyOnFinishAttribute).isNull()) {
        req.setAttribute(QNetworkRequest::AutoDeleteReplyOnFinishAttribute, true);
    }

    bool isLocalFile = req.url().isLocalFile();
    QString scheme = req.url().scheme();

    // Remap local+http to unix+http to make further processing easier
    if (scheme == "local+http"_L1) {
        scheme = u"unix+http"_s;
        QUrl url = req.url();
        url.setScheme(scheme);
        req.setUrl(url);
    }

    // fast path for GET on file:// URLs
    // The QNetworkAccessFileBackend will right now only be used for PUT
    if (op == QNetworkAccessManager::GetOperation
     || op == QNetworkAccessManager::HeadOperation) {
        if (isLocalFile
#ifdef Q_OS_ANDROID
            || scheme == "assets"_L1
#endif
            || scheme == "qrc"_L1) {
            return new QNetworkReplyFileImpl(this, req, op);
        }

        if (scheme == "data"_L1)
            return new QNetworkReplyDataImpl(this, req, op);

        // A request with QNetworkRequest::AlwaysCache does not need any bearer management
        QNetworkRequest::CacheLoadControl mode =
            static_cast<QNetworkRequest::CacheLoadControl>(
                req.attribute(QNetworkRequest::CacheLoadControlAttribute,
                              QNetworkRequest::PreferNetwork).toInt());
        if (mode == QNetworkRequest::AlwaysCache) {
            // FIXME Implement a QNetworkReplyCacheImpl instead, see QTBUG-15106
            QNetworkReplyImpl *reply = new QNetworkReplyImpl(this);
            QNetworkReplyImplPrivate *priv = reply->d_func();
            priv->manager = this;
            priv->backend = new QNetworkAccessCacheBackend();
            priv->backend->setManagerPrivate(this->d_func());
            priv->backend->setParent(reply);
            priv->backend->setReplyPrivate(priv);
            priv->setup(op, req, outgoingData);
            return reply;
        }
    }
    QNetworkRequest request = req;
    auto h = request.headers();
#ifndef Q_OS_WASM // Content-length header is not allowed to be set by user in wasm
    if (!h.contains(QHttpHeaders::WellKnownHeader::ContentLength) &&
        outgoingData && !outgoingData->isSequential()) {
        // request has no Content-Length
        // but the data that is outgoing is random-access
        h.append(QHttpHeaders::WellKnownHeader::ContentLength,
                 QByteArray::number(outgoingData->size()));
    }
#endif
    if (static_cast<QNetworkRequest::LoadControl>
        (request.attribute(QNetworkRequest::CookieLoadControlAttribute,
                           QNetworkRequest::Automatic).toInt()) == QNetworkRequest::Automatic) {
        if (d->cookieJar) {
            QList<QNetworkCookie> cookies = d->cookieJar->cookiesForUrl(request.url());
            if (!cookies.isEmpty())
                h.replaceOrAppend(QHttpHeaders::WellKnownHeader::Cookie,
                                  QNetworkHeadersPrivate::fromCookieList(cookies));
        }
    }
    request.setHeaders(std::move(h));
#ifdef Q_OS_WASM
    Q_UNUSED(isLocalFile);
    // Support http, https, and relative urls
    if (scheme == "http"_L1 || scheme == "https"_L1 || scheme.isEmpty()) {
        QNetworkReplyWasmImpl *reply = new QNetworkReplyWasmImpl(this);
        QNetworkReplyWasmImplPrivate *priv = reply->d_func();
        priv->manager = this;
        priv->setup(op, request, outgoingData);
        return reply;
    }
#endif

#if QT_CONFIG(http)
    constexpr char16_t httpSchemes[][17] = {
        u"http",
        u"preconnect-http",
#ifndef QT_NO_SSL
        u"https",
        u"preconnect-https",
#endif
        u"unix+http",
    };
    // Since Qt 5 we use the new QNetworkReplyHttpImpl
    if (std::find(std::begin(httpSchemes), std::end(httpSchemes), scheme) != std::end(httpSchemes)) {

#ifndef QT_NO_SSL
        const bool isLocalSocket = scheme.startsWith("unix"_L1);
        if (!isLocalSocket && isStrictTransportSecurityEnabled()
            && d->stsCache.isKnownHost(request.url())) {
            QUrl stsUrl(request.url());
            // RFC6797, 8.3:
            // The UA MUST replace the URI scheme with "https" [RFC2818],
            // and if the URI contains an explicit port component of "80",
            // then the UA MUST convert the port component to be "443", or
            // if the URI contains an explicit port component that is not
            // equal to "80", the port component value MUST be preserved;
            // otherwise,
            // if the URI does not contain an explicit port component, the UA
            // MUST NOT add one.
            if (stsUrl.port() == 80)
                stsUrl.setPort(443);
            stsUrl.setScheme("https"_L1);
            request.setUrl(stsUrl);
        }
#endif
        QNetworkReplyHttpImpl *reply = new QNetworkReplyHttpImpl(this, request, op, outgoingData);
        return reply;
    }
#endif // QT_CONFIG(http)

    // first step: create the reply
    QNetworkReplyImpl *reply = new QNetworkReplyImpl(this);
    QNetworkReplyImplPrivate *priv = reply->d_func();
    priv->manager = this;

    // second step: fetch cached credentials
    // This is not done for the time being, we should use signal emissions to request
    // the credentials from cache.

    // third step: find a backend
    priv->backend = d->findBackend(op, request);

    if (priv->backend) {
        priv->backend->setParent(reply);
        priv->backend->setReplyPrivate(priv);
    }

#ifndef QT_NO_SSL
    reply->setSslConfiguration(request.sslConfiguration());
#endif

    // fourth step: setup the reply
    priv->setup(op, request, outgoingData);

    return reply;
}